

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

uint64_t lzma_lzma_encoder_memusage(void *options)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t uVar3;
  lzma_lz_options_conflict lz_options;
  lzma_lz_options_conflict local_48;
  
  _Var1 = is_options_valid((lzma_options_lzma *)options);
  uVar2 = 0xffffffffffffffff;
  if (_Var1) {
    local_48.before_size = 0x1000;
    local_48.dict_size = (size_t)*options;
    local_48.after_size = 0x1001;
    local_48.match_len_max = 0x111;
    local_48.nice_len = (size_t)*(uint *)((long)options + 0x24);
    local_48.match_finder = *(lzma_match_finder *)((long)options + 0x28);
    local_48.depth = *(uint32_t *)((long)options + 0x2c);
    local_48.preset_dict = *(uint8_t **)((long)options + 8);
    local_48.preset_dict_size = *(uint32_t *)((long)options + 0x10);
    uVar3 = lzma_lz_encoder_memusage(&local_48);
    uVar2 = uVar3 + 0x3cee8;
    if (uVar3 == 0xffffffffffffffff) {
      uVar2 = 0xffffffffffffffff;
    }
  }
  return uVar2;
}

Assistant:

extern uint64_t
lzma_lzma_encoder_memusage(const void *options)
{
	if (!is_options_valid(options))
		return UINT64_MAX;

	lzma_lz_options lz_options;
	set_lz_options(&lz_options, options);

	const uint64_t lz_memusage = lzma_lz_encoder_memusage(&lz_options);
	if (lz_memusage == UINT64_MAX)
		return UINT64_MAX;

	return (uint64_t)(sizeof(lzma_lzma1_encoder)) + lz_memusage;
}